

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t binarySearch(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  ushort uVar1;
  bool bVar2;
  uint in_EAX;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = lenarray + -1;
  uVar5 = 0;
  do {
    if (iVar4 < (int)uVar5) {
      return ~uVar5;
    }
    uVar3 = uVar5 + iVar4 >> 1;
    uVar1 = *(ushort *)((long)array + (ulong)(uVar5 + iVar4 & 0xfffffffe));
    if (uVar1 < ikey) {
      uVar5 = uVar3 + 1;
      bVar2 = true;
      uVar3 = in_EAX;
    }
    else if (ikey < uVar1) {
      iVar4 = uVar3 - 1;
      bVar2 = true;
      uVar3 = in_EAX;
    }
    else {
      bVar2 = false;
    }
    in_EAX = uVar3;
  } while (bVar2);
  return uVar3;
}

Assistant:

inline int32_t binarySearch(const uint16_t *array, int32_t lenarray,
                            uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex];
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}